

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall
TApp_IncorrectConstructionFlagPositional3_Test::TestBody
          (TApp_IncorrectConstructionFlagPositional3_Test *this)

{
  bool bVar1;
  AssertHelper local_a0;
  Message local_98 [2];
  IncorrectConstruction *anon_var_0;
  string local_80;
  allocator local_59;
  string local_58;
  byte local_21;
  char *pcStack_20;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  bool x;
  TApp_IncorrectConstructionFlagPositional3_Test *this_local;
  
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffffe0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffffe0);
  if (bVar1) {
    local_21 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_58,"cat",&local_59);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_80,"",(allocator *)((long)&anon_var_0 + 7));
      CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
                (&(this->super_TApp).app,&local_58,(bool *)((long)&gtest_msg.value + 7),&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
    }
    if ((local_21 & 1) != 0) {
      return;
    }
    pcStack_20 = 
    "Expected: app.add_flag(\"cat\", x) throws an exception of type CLI::IncorrectConstruction.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_98);
  testing::internal::AssertHelper::AssertHelper
            (&local_a0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
             ,0x7b,pcStack_20);
  testing::internal::AssertHelper::operator=(&local_a0,local_98);
  testing::internal::AssertHelper::~AssertHelper(&local_a0);
  testing::Message::~Message(local_98);
  return;
}

Assistant:

TEST_F(TApp, IncorrectConstructionFlagPositional3) {
    bool x;
    EXPECT_THROW(app.add_flag("cat", x), CLI::IncorrectConstruction);
}